

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

void __thiscall
SingleNodeColumnSampler<long_double,_float>::restore
          (SingleNodeColumnSampler<long_double,_float> *this,
          SingleNodeColumnSampler<long_double,_float> *other)

{
  bool bVar1;
  pointer pdVar2;
  size_t *psVar3;
  pointer pdVar4;
  _Bit_type *p_Var5;
  _Bit_type *p_Var6;
  size_t sVar7;
  ulong uVar8;
  size_t sVar9;
  size_t col_1;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  
  this->n_inf = other->n_inf;
  sVar7 = other->n_left;
  this->n_left = sVar7;
  bVar1 = other->using_tree;
  this->using_tree = bVar1;
  if (bVar1 == true) {
    std::vector<double,std::allocator<double>>::
    _M_assign_aux<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>>
              ((vector<double,std::allocator<double>> *)&this->tree_weights,
               (other->tree_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               (other->tree_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish);
    std::vector<unsigned_long,std::allocator<unsigned_long>>::
    _M_assign_aux<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->mapped_inf_indices,
               (other->mapped_inf_indices).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
               (other->mapped_inf_indices).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish);
    return;
  }
  this->cumw = other->cumw;
  if ((sVar7 != 0 & this->backup_weights) == 1) {
    pdVar2 = (other->weights_own).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    psVar3 = this->col_indices;
    pdVar4 = (this->weights_own).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar9 = 0;
    do {
      pdVar4[psVar3[sVar9]] = pdVar2[sVar9];
      sVar9 = sVar9 + 1;
    } while (sVar7 != sVar9);
    sVar7 = this->n_left;
  }
  p_Var5 = (this->inifinite_weights).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  if ((((long)(this->inifinite_weights).super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - (long)p_Var5) * 8 +
       (ulong)(this->inifinite_weights).super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset != 0) &&
     (sVar7 != 0)) {
    p_Var6 = (other->inifinite_weights).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    psVar3 = this->col_indices;
    uVar10 = 0;
    do {
      uVar8 = uVar10 + 0x3f;
      if (-1 < (long)uVar10) {
        uVar8 = uVar10;
      }
      uVar11 = psVar3[uVar10];
      uVar12 = uVar11 + 0x3f;
      if (-1 < (long)uVar11) {
        uVar12 = uVar11;
      }
      lVar13 = (long)uVar12 >> 6;
      uVar12 = (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001);
      uVar11 = 1L << ((byte)uVar11 & 0x3f);
      if ((p_Var6[((long)uVar8 >> 6) +
                  (ulong)((uVar10 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff]
           >> (uVar10 & 0x3f) & 1) == 0) {
        uVar11 = ~uVar11 & p_Var5[lVar13 + uVar12 + 0xffffffffffffffff];
      }
      else {
        uVar11 = uVar11 | p_Var5[lVar13 + uVar12 + 0xffffffffffffffff];
      }
      p_Var5[lVar13 + uVar12 + 0xffffffffffffffff] = uVar11;
      uVar10 = uVar10 + 1;
    } while (uVar10 < this->n_left);
  }
  return;
}

Assistant:

void SingleNodeColumnSampler<ldouble_safe, real_t>::restore(const SingleNodeColumnSampler &other)
{
    this->n_inf = other.n_inf;
    this->n_left = other.n_left;
    this->using_tree = other.using_tree;

    if (this->using_tree)
    {
        this->tree_weights.assign(other.tree_weights.begin(), other.tree_weights.end());
        this->mapped_inf_indices.assign(other.mapped_inf_indices.begin(), other.mapped_inf_indices.end());
    }

    else
    {
        this->cumw = other.cumw;
        if (this->backup_weights)
        {
            for (size_t col = 0; col < this->n_left; col++)
                this->weights_own[this->col_indices[col]] = other.weights_own[col];
        }

        if (this->inifinite_weights.size())
        {
            for (size_t col = 0; col < this->n_left; col++)
                this->inifinite_weights[this->col_indices[col]] = other.inifinite_weights[col];
        }
    }
}